

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

int Fra_ClassesCountLits(Fra_Cla_t *p)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int i;
  ulong uVar7;
  
  iVar4 = p->vClasses1->nSize;
  lVar5 = (long)p->vClasses->nSize;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      iVar3 = iVar4;
      uVar2 = 0;
      do {
        uVar7 = uVar2;
        uVar2 = uVar7 + 1;
      } while (*(long *)((long)p->vClasses->pArray[lVar6] + uVar7 * 8) != 0);
      if (uVar7 < 2) {
        __assert_fail("nNodes > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                      ,0xac,"int Fra_ClassesCountLits(Fra_Cla_t *)");
      }
      iVar1 = (int)(uVar7 + 1);
      lVar6 = lVar6 + 1;
      iVar4 = iVar3 + iVar1 + -2;
    } while (lVar6 != lVar5);
    iVar4 = iVar3 + iVar1 + -2;
  }
  return iVar4;
}

Assistant:

int Fra_ClassesCountLits( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nLits = 0;
    nLits = Vec_PtrSize( p->vClasses1 );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nLits += nNodes - 1;
    }
    return nLits;
}